

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O2

void __thiscall
QToolBarAreaLayout::insertItem(QToolBarAreaLayout *this,DockPosition pos,QLayoutItem *item)

{
  iterator iVar1;
  long in_FS_OFFSET;
  undefined1 local_58 [24];
  QArrayDataPointer<QToolBarAreaLayoutItem> local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->docks[pos].lines.d.size == 0) {
    local_58._16_4_ = this->docks[pos].o;
    local_58._0_8_ = (QLayoutItem *)0x0;
    local_58._8_4_ = -1;
    local_58._12_4_ = -1;
    local_40.d = (Data *)0x0;
    local_40.ptr = (QToolBarAreaLayoutItem *)0x0;
    local_40.size = 0;
    QList<QToolBarAreaLayoutLine>::emplaceBack<QToolBarAreaLayoutLine>
              (&this->docks[pos].lines,(QToolBarAreaLayoutLine *)local_58);
    QArrayDataPointer<QToolBarAreaLayoutItem>::~QArrayDataPointer(&local_40);
  }
  iVar1 = QList<QToolBarAreaLayoutLine>::end(&this->docks[pos].lines);
  local_58._8_4_ = 0;
  local_58._12_4_ = -1;
  local_58._16_4_ = 0xffffffff;
  local_58[0x14] = false;
  local_58._0_8_ = item;
  QList<QToolBarAreaLayoutItem>::emplaceBack<QToolBarAreaLayoutItem>
            (&iVar1.i[-1].toolBarItems,(QToolBarAreaLayoutItem *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBarAreaLayout::insertItem(QInternal::DockPosition pos, QLayoutItem *item)
{
    if (docks[pos].lines.isEmpty())
        docks[pos].lines.append(QToolBarAreaLayoutLine(docks[pos].o));
    docks[pos].lines.last().toolBarItems.append(item);
}